

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_5.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  exception *e;
  undefined1 local_28 [8];
  Date tomorrow;
  Month MStack_14;
  Date today;
  
  Date::Date((Date *)&tomorrow.d,0x7cc,dec,5);
  local_28._0_4_ = tomorrow.d;
  local_28._4_4_ = MStack_14;
  Date::add_year((Date *)local_28,0x17);
  Date::add_month((Date *)local_28,5);
  poVar1 = operator<<((ostream *)&std::cout,(Date *)&tomorrow.d);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = operator<<(poVar1,(Date *)local_28);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
	Date today{ 1996, Month::dec, 5 };
	Date tomorrow = today;

	try
	{
		tomorrow.add_year(23);
		tomorrow.add_month(5);
		std::cout << today
			<< '\n' << tomorrow << std::endl;
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}